

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_rune * nk_textedit_createundo(nk_text_undo_state *state,int pos,int insert_len,int delete_len)

{
  nk_text_undo_record *pnVar1;
  short sVar2;
  short sVar3;
  nk_rune *pnVar4;
  
  state->redo_point = 99;
  state->redo_char_point = 999;
  if (state->undo_point == 99) {
    nk_textedit_discard_undo(state);
  }
  if (insert_len < 1000) {
    sVar2 = state->undo_char_point;
    while (999 < sVar2 + insert_len) {
      nk_textedit_discard_undo(state);
      sVar2 = state->undo_char_point;
    }
    sVar3 = state->undo_point;
    state->undo_point = sVar3 + 1;
    pnVar1 = state->undo_rec + sVar3;
    pnVar1->where = pos;
    pnVar1->insert_length = (short)insert_len;
    pnVar1->delete_length = (short)delete_len;
    if (insert_len == 0) {
      pnVar1->char_storage = -1;
      pnVar4 = (nk_rune *)0x0;
    }
    else {
      pnVar1->char_storage = sVar2;
      state->undo_char_point = (short)insert_len + sVar2;
      pnVar4 = state->undo_char + sVar2;
    }
  }
  else {
    pnVar4 = (nk_rune *)0x0;
    state->undo_point = 0;
    state->undo_char_point = 0;
  }
  return pnVar4;
}

Assistant:

NK_INTERN nk_rune*
nk_textedit_createundo(struct nk_text_undo_state *state, int pos,
    int insert_len, int delete_len)
{
    struct nk_text_undo_record *r = nk_textedit_create_undo_record(state, insert_len);
    if (r == 0)
        return 0;

    r->where = pos;
    r->insert_length = (short) insert_len;
    r->delete_length = (short) delete_len;

    if (insert_len == 0) {
        r->char_storage = -1;
        return 0;
    } else {
        r->char_storage = state->undo_char_point;
        state->undo_char_point = (short)(state->undo_char_point +  insert_len);
        return &state->undo_char[r->char_storage];
    }
}